

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int resize_properties(JSContext *ctx,JSShape **psh,JSObject *p,uint32_t count)

{
  uint uVar1;
  uint32_t uVar2;
  void *pvVar3;
  uint32_t *puVar4;
  ulong uVar5;
  void *pvVar6;
  int in_ECX;
  long in_RDX;
  long *in_RSI;
  list_head *in_RDI;
  JSShape *old_sh;
  JSProperty *new_prop;
  intptr_t h;
  void *sh_alloc;
  JSShapeProperty *pr;
  uint32_t i;
  uint32_t new_hash_mask;
  uint32_t new_hash_size;
  uint32_t new_size;
  JSShape *sh;
  list_head *in_stack_ffffffffffffff68;
  JSContext *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  void *in_stack_ffffffffffffff90;
  JSContext *in_stack_ffffffffffffff98;
  JSShape *local_48;
  uint local_40;
  uint local_38;
  JSShape *local_30;
  
  pvVar6 = (void *)*in_RSI;
  uVar1 = max_int(in_ECX,(*(int *)((long)pvVar6 + 0x24) * 3) / 2);
  if (in_RDX != 0) {
    pvVar3 = js_realloc(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                        CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if (pvVar3 == (void *)0x0) {
      return -1;
    }
    *(void **)(in_RDX + 0x20) = pvVar3;
  }
  for (local_38 = *(int *)((long)pvVar6 + 0x20) + 1; local_38 < uVar1; local_38 = local_38 << 1) {
  }
  if (local_38 == *(int *)((long)pvVar6 + 0x20) + 1U) {
    list_del((list_head *)((long)pvVar6 + 8));
    get_alloc_from_shape((JSShape *)0x1579ab);
    get_shape_size((ulong)local_38,(ulong)uVar1);
    pvVar6 = js_realloc(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                        CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if (pvVar6 == (void *)0x0) {
      list_add_tail(in_RDI,in_stack_ffffffffffffff68);
      return -1;
    }
    local_30 = get_shape_from_alloc(pvVar6,(ulong)local_38);
    list_add_tail(in_RDI,in_stack_ffffffffffffff68);
  }
  else {
    get_shape_size((ulong)local_38,(ulong)uVar1);
    pvVar3 = js_malloc((JSContext *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                       in_stack_ffffffffffffff80);
    if (pvVar3 == (void *)0x0) {
      return -1;
    }
    local_30 = get_shape_from_alloc(pvVar3,(ulong)local_38);
    list_del((list_head *)((long)pvVar6 + 8));
    memcpy(local_30,pvVar6,(long)*(int *)((long)pvVar6 + 0x28) * 8 + 0x40);
    list_add_tail((list_head *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    local_30->prop_hash_mask = local_38 - 1;
    puVar4 = prop_hash_end(local_30);
    memset(puVar4 + -(ulong)local_38,0,(ulong)local_38 << 2);
    local_48 = local_30 + 1;
    for (local_40 = 0; local_40 < (uint)local_30->prop_count; local_40 = local_40 + 1) {
      if (*(int *)&(local_48->header).field_0x4 != 0) {
        uVar5 = (ulong)(*(uint *)&(local_48->header).field_0x4 & local_38 - 1);
        puVar4 = prop_hash_end(local_30);
        (local_48->header).ref_count =
             (local_48->header).ref_count & 0xfc000000U | puVar4[-1 - uVar5] & 0x3ffffff;
        uVar2 = local_40 + 1;
        puVar4 = prop_hash_end(local_30);
        puVar4[-1 - uVar5] = uVar2;
      }
      local_48 = (JSShape *)&(local_48->header).link;
    }
    get_alloc_from_shape((JSShape *)0x157974);
    js_free(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  *in_RSI = (long)local_30;
  local_30->prop_size = uVar1;
  return 0;
}

Assistant:

static no_inline int resize_properties(JSContext *ctx, JSShape **psh,
                                       JSObject *p, uint32_t count)
{
    JSShape *sh;
    uint32_t new_size, new_hash_size, new_hash_mask, i;
    JSShapeProperty *pr;
    void *sh_alloc;
    intptr_t h;

    sh = *psh;
    new_size = max_int(count, sh->prop_size * 3 / 2);
    /* Reallocate prop array first to avoid crash or size inconsistency
       in case of memory allocation failure */
    if (p) {
        JSProperty *new_prop;
        new_prop = js_realloc(ctx, p->prop, sizeof(new_prop[0]) * new_size);
        if (unlikely(!new_prop))
            return -1;
        p->prop = new_prop;
    }
    new_hash_size = sh->prop_hash_mask + 1;
    while (new_hash_size < new_size)
        new_hash_size = 2 * new_hash_size;
    if (new_hash_size != (sh->prop_hash_mask + 1)) {
        JSShape *old_sh;
        /* resize the hash table and the properties */
        old_sh = sh;
        sh_alloc = js_malloc(ctx, get_shape_size(new_hash_size, new_size));
        if (!sh_alloc)
            return -1;
        sh = get_shape_from_alloc(sh_alloc, new_hash_size);
        list_del(&old_sh->header.link);
        /* copy all the fields and the properties */
        memcpy(sh, old_sh,
               sizeof(JSShape) + sizeof(sh->prop[0]) * old_sh->prop_count);
        list_add_tail(&sh->header.link, &ctx->rt->gc_obj_list);
        new_hash_mask = new_hash_size - 1;
        sh->prop_hash_mask = new_hash_mask;
        memset(prop_hash_end(sh) - new_hash_size, 0,
               sizeof(prop_hash_end(sh)[0]) * new_hash_size);
        for(i = 0, pr = sh->prop; i < sh->prop_count; i++, pr++) {
            if (pr->atom != JS_ATOM_NULL) {
                h = ((uintptr_t)pr->atom & new_hash_mask);
                pr->hash_next = prop_hash_end(sh)[-h - 1];
                prop_hash_end(sh)[-h - 1] = i + 1;
            }
        }
        js_free(ctx, get_alloc_from_shape(old_sh));
    } else {
        /* only resize the properties */
        list_del(&sh->header.link);
        sh_alloc = js_realloc(ctx, get_alloc_from_shape(sh),
                              get_shape_size(new_hash_size, new_size));
        if (unlikely(!sh_alloc)) {
            /* insert again in the GC list */
            list_add_tail(&sh->header.link, &ctx->rt->gc_obj_list);
            return -1;
        }
        sh = get_shape_from_alloc(sh_alloc, new_hash_size);
        list_add_tail(&sh->header.link, &ctx->rt->gc_obj_list);
    }
    *psh = sh;
    sh->prop_size = new_size;
    return 0;
}